

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::
     PrintTupleTo<std::tuple<pstore::brokerface::fifo_path_const&,pstore::broker::broker_command_const&>,2ul>
               (tuple<const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&>
                *t,ostream *param_2)

{
  broker_command *value;
  ostream *os_local;
  tuple<const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&> *t_local;
  
  PrintTupleTo<std::tuple<pstore::brokerface::fifo_path_const&,pstore::broker::broker_command_const&>,1ul>
            (t,param_2);
  std::operator<<(param_2,", ");
  value = std::get<1ul,pstore::brokerface::fifo_path_const&,pstore::broker::broker_command_const&>
                    (t);
  UniversalPrinter<const_pstore::broker::broker_command_&>::Print(value,param_2);
  return;
}

Assistant:

void PrintTupleTo(const T& t, std::integral_constant<size_t, I>,
                  ::std::ostream* os) {
  PrintTupleTo(t, std::integral_constant<size_t, I - 1>(), os);
  GTEST_INTENTIONAL_CONST_COND_PUSH_()
  if (I > 1) {
    GTEST_INTENTIONAL_CONST_COND_POP_()
    *os << ", ";
  }
  UniversalPrinter<typename std::tuple_element<I - 1, T>::type>::Print(
      std::get<I - 1>(t), os);
}